

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeCheckpoint(Btree *p,int eMode,int *pnLog,int *pnCkpt)

{
  BtShared *pBVar1;
  BtShared *pBt;
  int rc;
  int *pnCkpt_local;
  int *pnLog_local;
  int eMode_local;
  Btree *p_local;
  
  pBt._4_4_ = 0;
  if (p != (Btree *)0x0) {
    pBVar1 = p->pBt;
    sqlite3BtreeEnter(p);
    if (pBVar1->inTransaction == '\0') {
      pBt._4_4_ = sqlite3PagerCheckpoint(pBVar1->pPager,p->db,eMode,pnLog,pnCkpt);
    }
    else {
      pBt._4_4_ = 6;
    }
    sqlite3BtreeLeave(p);
  }
  return pBt._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCheckpoint(Btree *p, int eMode, int *pnLog, int *pnCkpt){
  int rc = SQLITE_OK;
  if( p ){
    BtShared *pBt = p->pBt;
    sqlite3BtreeEnter(p);
    if( pBt->inTransaction!=TRANS_NONE ){
      rc = SQLITE_LOCKED;
    }else{
      rc = sqlite3PagerCheckpoint(pBt->pPager, p->db, eMode, pnLog, pnCkpt);
    }
    sqlite3BtreeLeave(p);
  }
  return rc;
}